

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O0

void __thiscall
CaptureETCaptureLValueRight::~CaptureETCaptureLValueRight(CaptureETCaptureLValueRight *this)

{
  CaptureETCaptureLValueRight *this_local;
  
  ~CaptureETCaptureLValueRight(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(ETCaptureLValueRight, Capture)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestETCaptureLValueRight myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "0 == 1";
  return oss.str().find(expected) != string::npos;
}